

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void MyDocument::DisplayContextMenu(MyDocument *doc)

{
  bool bVar1;
  char local_118 [8];
  char buf [256];
  MyDocument *doc_local;
  
  bVar1 = ImGui::BeginPopupContextItem((char *)0x0,1);
  if (bVar1) {
    sprintf(local_118,"Save %s",doc->Name);
    bVar1 = ImGui::MenuItem(local_118,"CTRL+S",false,(bool)(doc->Open & 1));
    if (bVar1) {
      DoSave(doc);
    }
    bVar1 = ImGui::MenuItem("Close","CTRL+W",false,(bool)(doc->Open & 1));
    if (bVar1) {
      DoQueueClose(doc);
    }
    ImGui::EndPopup();
  }
  return;
}

Assistant:

static void DisplayContextMenu(MyDocument* doc)
    {
        if (!ImGui::BeginPopupContextItem())
            return;

        char buf[256];
        sprintf(buf, "Save %s", doc->Name);
        if (ImGui::MenuItem(buf, "CTRL+S", false, doc->Open))
            doc->DoSave();
        if (ImGui::MenuItem("Close", "CTRL+W", false, doc->Open))
            doc->DoQueueClose();
        ImGui::EndPopup();
    }